

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# XSObjectFactory.cpp
# Opt level: O3

XSAnnotation * __thiscall
xercesc_4_0::XSObjectFactory::getAnnotationFromModel
          (XSObjectFactory *this,XSModel *xsModel,void *key)

{
  BaseRefVectorOf<xercesc_4_0::XSNamespaceItem> *this_00;
  RefHashTableOf<xercesc_4_0::XSAnnotation,_xercesc_4_0::PtrHasher> *pRVar1;
  XSNamespaceItem *pXVar2;
  RefHashTableBucketElem<xercesc_4_0::XSAnnotation> *pRVar3;
  XMLSize_t getAt;
  
  do {
    this_00 = &xsModel->fXSNamespaceItemList->super_BaseRefVectorOf<xercesc_4_0::XSNamespaceItem>;
    if (this_00->fCurCount != 0) {
      getAt = 0;
      do {
        pXVar2 = BaseRefVectorOf<xercesc_4_0::XSNamespaceItem>::elementAt(this_00,getAt);
        if (pXVar2->fGrammar != (SchemaGrammar *)0x0) {
          pRVar1 = pXVar2->fGrammar->fAnnotations;
          for (pRVar3 = pRVar1->fBucketList[(ulong)key % pRVar1->fHashModulus];
              pRVar3 != (RefHashTableBucketElem<xercesc_4_0::XSAnnotation> *)0x0;
              pRVar3 = pRVar3->fNext) {
            if (pRVar3->fKey == key) {
              if (pRVar3->fData != (XSAnnotation *)0x0) {
                return pRVar3->fData;
              }
              break;
            }
          }
        }
        getAt = (XMLSize_t)((int)getAt + 1);
      } while (getAt < this_00->fCurCount);
    }
    xsModel = xsModel->fParent;
    if (xsModel == (XSModel *)0x0) {
      return (XSAnnotation *)0x0;
    }
  } while( true );
}

Assistant:

XSAnnotation* XSObjectFactory::getAnnotationFromModel(XSModel* const xsModel,
                                               const void* const key)
{
    XSNamespaceItemList* namespaceItemList = xsModel->getNamespaceItems();

    XSAnnotation* annot = 0;
    for (unsigned int i=0; i<namespaceItemList->size(); i++)
    {
        XSNamespaceItem* nsItem = namespaceItemList->elementAt(i);
        if (nsItem->fGrammar)
        {
            annot = nsItem->fGrammar->getAnnotation(key);
            if (annot)
                return annot;
        }
    }

    if (xsModel->fParent)
        return getAnnotationFromModel(xsModel->fParent, key);
    return 0;
}